

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_swap.c
# Opt level: O0

REF_STATUS ref_swap_remove_two_face_cell(REF_GRID ref_grid,REF_INT cell)

{
  REF_CELL ref_cell_00;
  REF_INT RVar1;
  REF_STATUS RVar2;
  uint uVar3;
  REF_STATUS ref_private_macro_code_rss_5;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_INT face;
  REF_INT temp;
  REF_INT faceid1;
  REF_INT faceid0;
  REF_INT cell_face1;
  REF_INT cell_face0;
  REF_INT face1;
  REF_INT face0;
  REF_INT found;
  REF_INT face_nodes [4];
  REF_INT cell_nodes [4];
  int local_30;
  int local_2c;
  REF_INT node;
  REF_INT cell_face;
  REF_CELL ref_cell;
  REF_INT cell_local;
  REF_GRID ref_grid_local;
  
  ref_cell_00 = ref_grid->cell[8];
  cell_face0 = -1;
  cell_face1 = -1;
  temp = -1;
  face = -1;
  faceid0 = -1;
  faceid1 = -1;
  for (local_2c = 0; local_2c < 4; local_2c = local_2c + 1) {
    for (local_30 = 0; local_30 < 4; local_30 = local_30 + 1) {
      face_nodes[(long)local_30 + 2] =
           ref_cell_00->c2n
           [ref_cell_00->f2n[local_30 + local_2c * 4] + ref_cell_00->size_per * cell];
    }
    RVar2 = ref_cell_with(ref_grid->cell[3],face_nodes + 2,&face1);
    if (RVar2 == 0) {
      uVar3 = ref_cell_nodes(ref_grid->cell[3],face1,&face0);
      if (uVar3 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_swap.c",0x38
               ,"ref_swap_remove_two_face_cell",(ulong)uVar3,"tri");
        return uVar3;
      }
      if (cell_face0 == -1) {
        cell_face0 = face1;
        temp = face_nodes[1];
        faceid0 = local_2c;
      }
      else {
        if (cell_face1 != -1) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_swap.c",
                 0x3f,"ref_swap_remove_two_face_cell",3,"three or more faces detected");
          return 3;
        }
        cell_face1 = face1;
        face = face_nodes[1];
        faceid1 = local_2c;
      }
    }
  }
  if (cell_face0 == -1) {
    ref_grid_local._4_4_ = 3;
  }
  else if (cell_face1 == -1) {
    ref_grid_local._4_4_ = 3;
  }
  else if (temp == face) {
    ref_grid_local._4_4_ = ref_cell_remove(ref_grid->cell[3],cell_face0);
    if (ref_grid_local._4_4_ == 0) {
      ref_grid_local._4_4_ = ref_cell_remove(ref_grid->cell[3],cell_face1);
      if (ref_grid_local._4_4_ == 0) {
        for (local_2c = 0; local_2c < 4; local_2c = local_2c + 1) {
          for (local_30 = 0; RVar1 = face_nodes[2], local_30 < 4; local_30 = local_30 + 1) {
            face_nodes[(long)local_30 + 2] =
                 ref_cell_00->c2n
                 [ref_cell_00->f2n[local_30 + local_2c * 4] + ref_cell_00->size_per * cell];
          }
          if ((local_2c != faceid0) && (local_2c != faceid1)) {
            ref_private_macro_code_rss = face_nodes[2];
            face_nodes[2] = face_nodes[3];
            face_nodes[3] = RVar1;
            uVar3 = ref_cell_add(ref_grid->cell[3],face_nodes + 2,&ref_private_macro_code_rss_1);
            if (uVar3 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_swap.c"
                     ,0x57,"ref_swap_remove_two_face_cell",(ulong)uVar3,"add tri");
              return uVar3;
            }
          }
        }
        ref_grid_local._4_4_ = ref_cell_remove(ref_cell_00,cell);
        if (ref_grid_local._4_4_ == 0) {
          ref_grid_local._4_4_ = 0;
        }
        else {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_swap.c",
                 0x5b,"ref_swap_remove_two_face_cell",(ulong)ref_grid_local._4_4_,"remove tet");
        }
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_swap.c",0x4d
               ,"ref_swap_remove_two_face_cell",(ulong)ref_grid_local._4_4_,"remove tri1");
      }
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_swap.c",0x4c,
             "ref_swap_remove_two_face_cell",(ulong)ref_grid_local._4_4_,"remove tri0");
    }
  }
  else {
    ref_grid_local._4_4_ = 3;
  }
  return ref_grid_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_swap_remove_two_face_cell(REF_GRID ref_grid,
                                                 REF_INT cell) {
  REF_CELL ref_cell;
  REF_INT cell_face;
  REF_INT node;
  REF_INT cell_nodes[4];
  REF_INT face_nodes[4];
  REF_INT found;
  REF_INT face0, face1;
  REF_INT cell_face0, cell_face1;
  REF_INT faceid0, faceid1;
  REF_INT temp, face;

  ref_cell = ref_grid_tet(ref_grid);

  face0 = REF_EMPTY;
  face1 = REF_EMPTY;
  faceid0 = REF_EMPTY;
  faceid1 = REF_EMPTY;
  cell_face0 = REF_EMPTY;
  cell_face1 = REF_EMPTY;
  for (cell_face = 0; cell_face < 4; cell_face++) {
    for (node = 0; node < 4; node++)
      cell_nodes[node] = ref_cell_f2n(ref_cell, node, cell_face, cell);
    if (REF_SUCCESS ==
        ref_cell_with(ref_grid_tri(ref_grid), cell_nodes, &found)) {
      RSS(ref_cell_nodes(ref_grid_tri(ref_grid), found, face_nodes), "tri");
      if (REF_EMPTY == face0) {
        face0 = found;
        faceid0 = face_nodes[3];
        cell_face0 = cell_face;
      } else {
        if (REF_EMPTY != face1) {
          RSS(REF_INVALID, "three or more faces detected");
        }
        face1 = found;
        faceid1 = face_nodes[3];
        cell_face1 = cell_face;
      }
    }
  }

  if (REF_EMPTY == face0) return REF_INVALID;
  if (REF_EMPTY == face1) return REF_INVALID;
  if (faceid0 != faceid1) return REF_INVALID;

  RSS(ref_cell_remove(ref_grid_tri(ref_grid), face0), "remove tri0");
  RSS(ref_cell_remove(ref_grid_tri(ref_grid), face1), "remove tri1");

  for (cell_face = 0; cell_face < 4; cell_face++) {
    for (node = 0; node < 4; node++)
      cell_nodes[node] = ref_cell_f2n(ref_cell, node, cell_face, cell);
    if (cell_face != cell_face0 && cell_face != cell_face1) {
      cell_nodes[3] = faceid0;
      temp = cell_nodes[0];
      cell_nodes[0] = cell_nodes[1];
      cell_nodes[1] = temp;
      RSS(ref_cell_add(ref_grid_tri(ref_grid), cell_nodes, &face), "add tri");
    }
  }

  RSS(ref_cell_remove(ref_cell, cell), "remove tet");

  return REF_SUCCESS;
}